

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_unmark_rec(MTBDD mtbdd)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  
  lVar2 = (mtbdd & 0xffffffffff) * 0x10;
  uVar1 = *(ulong *)(nodes->data + lVar2);
  if ((uVar1 >> 0x3d & 1) != 0) {
    puVar3 = (ulong *)(nodes->data + lVar2);
    do {
      *puVar3 = uVar1 & 0xdfffffffffffffff;
      if ((uVar1 >> 0x3e & 1) != 0) {
        return;
      }
      mtbdd_unmark_rec(puVar3[1] & 0xffffffffff);
      lVar2 = (*puVar3 & 0xffffffffff) * 0x10;
      puVar3 = (ulong *)(nodes->data + lVar2);
      uVar1 = *(ulong *)(nodes->data + lVar2);
    } while ((uVar1 & 0x2000000000000000) != 0);
  }
  return;
}

Assistant:

static void
mtbdd_unmark_rec(MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (!mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 0);
    if (mtbddnode_isleaf(n)) return;
    mtbdd_unmark_rec(mtbddnode_getlow(n));
    mtbdd_unmark_rec(mtbddnode_gethigh(n));
}